

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
::
ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>::VarHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,testing::NiceMock<MockNLHandler>>
           *this)

{
  int iVar1;
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  char *pcVar2;
  double dVar3;
  int gmock_a1;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  undefined8 local_48;
  undefined8 uStack_40;
  ArgList local_30;
  
  iVar1 = **(int **)(this + 8);
  if (0 < iVar1) {
    gmock_a1 = 0;
    do {
      this_00 = *(BinaryReader<mp::internal::EndiannessConverter> **)this;
      pcVar2 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar2;
      (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar2 + 1;
      dVar6 = INFINITY;
      uVar4 = 0;
      uVar5 = 0xfff00000;
      switch(*pcVar2) {
      case '0':
        dVar3 = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
        dVar6 = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble
                          (*(BinaryReader<mp::internal::EndiannessConverter> **)this);
        uVar4 = SUB84(dVar3,0);
        uVar5 = (undefined4)((ulong)dVar3 >> 0x20);
        break;
      case '1':
        dVar6 = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
        uVar4 = 0;
        uVar5 = 0xfff00000;
        break;
      case '2':
        dVar6 = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
        uVar4 = SUB84(dVar6,0);
        uVar5 = (undefined4)((ulong)dVar6 >> 0x20);
        dVar6 = INFINITY;
        break;
      case '3':
        break;
      case '4':
        dVar6 = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
        uVar4 = SUB84(dVar6,0);
        uVar5 = (undefined4)((ulong)dVar6 >> 0x20);
        break;
      case '5':
        local_30.field_1.values_ = (Value *)&local_48;
        local_48 = 0;
        uStack_40 = 0;
        local_30.types_ = 0;
        BinaryReaderBase::ReportError
                  (&this_00->super_BinaryReaderBase,(CStringRef)0x2657e8,&local_30);
      default:
        local_30.field_1.values_ = (Value *)&local_48;
        local_48 = 0;
        uStack_40 = 0;
        local_30.types_ = 0;
        BinaryReaderBase::ReportError
                  (&this_00->super_BinaryReaderBase,(CStringRef)0x2656a6,&local_30);
      }
      MockNLHandler::OnVarBounds
                (*(MockNLHandler **)(this + 0x10),gmock_a1,(Argument2)CONCAT44(uVar5,uVar4),dVar6);
      gmock_a1 = gmock_a1 + 1;
    } while (iVar1 != gmock_a1);
  }
  return;
}

Assistant:

void SetBounds(int index, double lb, double ub) {
      this->reader_.handler_.OnVarBounds(index, lb, ub);
    }